

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::Generate
          (MessageBuilderGenerator *this,Printer *printer)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr *pp_Var2;
  OneofDescriptor *oneof;
  long lVar3;
  long lVar4;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
  _Var5;
  char *buffer;
  bool bVar6;
  int iVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  Descriptor *pDVar10;
  LogMessage *pLVar11;
  long *plVar12;
  Descriptor *descriptor;
  Descriptor *descriptor_00;
  MessageBuilderGenerator *extraout_RDX;
  MessageBuilderGenerator *extraout_RDX_00;
  MessageBuilderGenerator *pMVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  long lVar18;
  LogMessage local_f8;
  int *local_c0 [2];
  int local_b0 [10];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  pDVar10 = this->descriptor_;
  if (*(int *)(pDVar10 + 0x78) < 1) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_f8,this->name_resolver_,pDVar10,true);
    ExtraBuilderInterfaces_abi_cxx11_((string *)local_c0,(java *)this->descriptor_,descriptor_00);
    pp_Var2 = &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         CONCAT53(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._3_5_,0x3356);
    vars._M_t._M_impl._0_8_ = pp_Var2;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3f42d2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [4])0x3e4f76,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    if ((_Base_ptr *)vars._M_t._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)vars._M_t._M_impl._0_8_);
    }
    if (local_c0[0] != &((LogMessage *)local_c0)->line_) {
      operator_delete(local_c0[0]);
    }
    if ((char *)local_f8._0_8_ == (char *)((long)&local_f8 + 0x10U)) goto LAB_002d182d;
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&local_f8,this->name_resolver_,pDVar10,true);
    ExtraBuilderInterfaces_abi_cxx11_((string *)local_c0,(java *)this->descriptor_,descriptor);
    pp_Var2 = &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 2;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)
         CONCAT53(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._3_5_,0x3356);
    vars._M_t._M_impl._0_8_ = pp_Var2;
    io::Printer::
    Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[4],std::__cxx11::string>
              (printer,
               "public static final class Builder extends\n    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
               ,(char (*) [10])0x3f42d2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
               (char (*) [17])"extra_interfaces",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
               (char (*) [4])0x3e4f76,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars);
    if ((_Base_ptr *)vars._M_t._M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)vars._M_t._M_impl._0_8_);
    }
    if (local_c0[0] != &((LogMessage *)local_c0)->line_) {
      operator_delete(local_c0[0]);
    }
    if ((char *)local_f8._0_8_ == (char *)((long)&local_f8 + 0x10U)) goto LAB_002d182d;
  }
  operator_delete((void *)local_f8._0_8_);
LAB_002d182d:
  io::Printer::Indent(printer);
  GenerateDescriptorMethods(this,printer);
  GenerateCommonBuilderMethods(this,printer);
  bVar6 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
  if (bVar6) {
    GenerateIsInitialized(this,printer);
    GenerateBuilderParsingMethods(this,printer);
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  iVar15 = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var9 = (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var9 != p_Var1) {
    buffer = (char *)((long)&local_f8 + 0x10);
    do {
      oneof = *(OneofDescriptor **)(p_Var9 + 1);
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_f8._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"oneof_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_f8);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((char *)local_f8._0_8_ != buffer) {
        operator_delete((void *)local_f8._0_8_);
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_f8._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"oneof_capitalized_name","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_f8);
      std::__cxx11::string::_M_assign((string *)pmVar8);
      if ((char *)local_f8._0_8_ != buffer) {
        operator_delete((void *)local_f8._0_8_);
      }
      local_f8._0_8_ = buffer;
      local_f8.filename_ =
           FastInt32ToBufferLeft
                     ((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) >> 3) *
                      -0x33333333,buffer);
      local_f8.filename_ = local_f8.filename_ + -(long)buffer;
      local_c0[0] = &((LogMessage *)local_c0)->line_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c0,local_f8._0_8_,local_f8.filename_ + local_f8._0_8_);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"oneof_index","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_50);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_c0[0] != &((LogMessage *)local_c0)->line_) {
        operator_delete(local_c0[0]);
      }
      io::Printer::Print(printer,&vars,
                         "private int $oneof_name$Case_ = 0;\nprivate java.lang.Object $oneof_name$_;\n"
                        );
      io::Printer::Print(printer,&vars,
                         "public $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return $oneof_capitalized_name$Case.forNumber(\n      $oneof_name$Case_);\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  $oneof_name$Case_ = 0;\n  $oneof_name$_ = null;\n"
                        );
      io::Printer::Print<>(printer,"  onChanged();\n");
      io::Printer::Print<>(printer,"  return this;\n}\n\n");
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var1);
  }
  pDVar10 = this->descriptor_;
  if (0 < *(int *)(pDVar10 + 4)) {
    lVar18 = 0;
    lVar17 = 0;
    iVar15 = 0;
    do {
      lVar3 = *(long *)(pDVar10 + 0x28);
      if (*(Descriptor **)(lVar3 + 0x20 + lVar18) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        pLVar11 = internal::LogMessage::operator<<
                            ((LogMessage *)local_c0,
                             "CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_f8,pLVar11);
        internal::LogMessage::~LogMessage((LogMessage *)local_c0);
      }
      if ((*(byte *)(lVar3 + 1 + lVar18) & 8) == 0) {
        plVar12 = (long *)(*(long *)(lVar3 + 0x20 + lVar18) + 0x28);
      }
      else {
        lVar4 = *(long *)(lVar3 + 0x28 + lVar18);
        if (lVar4 == 0) {
          plVar12 = (long *)(*(long *)(lVar3 + 0x10 + lVar18) + 0x70);
        }
        else {
          plVar12 = (long *)(lVar4 + 0x50);
        }
      }
      iVar7 = (**(code **)(*(long *)(this->field_generators_).field_generators_.
                                    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [(int)((ulong)((lVar3 - *plVar12) + lVar18) >> 3) * 0x38e38e39].
                                    _M_t.
                                    super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                                    ._M_t + 0x18))();
      iVar15 = iVar15 + iVar7;
      lVar17 = lVar17 + 1;
      pDVar10 = this->descriptor_;
      lVar18 = lVar18 + 0x48;
    } while (lVar17 < *(int *)(pDVar10 + 4));
  }
  if (0 < iVar15) {
    uVar16 = iVar15 + 0x1fU >> 5;
    uVar14 = 1;
    if (1 < uVar16) {
      uVar14 = uVar16;
    }
    uVar16 = 0;
    pMVar13 = this;
    do {
      GetBitFieldName_abi_cxx11_((string *)&local_f8,(java *)(ulong)uVar16,(int)pMVar13);
      io::Printer::Print<char[15],std::__cxx11::string>
                (printer,"private int $bit_field_name$;\n",(char (*) [15])"bit_field_name",
                 (string *)&local_f8);
      pMVar13 = extraout_RDX;
      if ((char *)local_f8._0_8_ != (char *)((long)&local_f8 + 0x10U)) {
        operator_delete((void *)local_f8._0_8_);
        pMVar13 = extraout_RDX_00;
      }
      uVar16 = uVar16 + 1;
    } while (uVar14 != uVar16);
  }
  if (0 < *(int *)(this->descriptor_ + 4)) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar3 = *(long *)(this->descriptor_ + 0x28);
      if (*(Descriptor **)(lVar3 + 0x20 + lVar17) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        pLVar11 = internal::LogMessage::operator<<
                            (&local_f8,"CHECK failed: (field->containing_type()) == (descriptor_): "
                            );
        internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar11);
        internal::LogMessage::~LogMessage(&local_f8);
      }
      if ((*(byte *)(lVar3 + 1 + lVar17) & 8) == 0) {
        plVar12 = (long *)(*(long *)(lVar3 + 0x20 + lVar17) + 0x28);
      }
      else {
        lVar4 = *(long *)(lVar3 + 0x28 + lVar17);
        if (lVar4 == 0) {
          plVar12 = (long *)(*(long *)(lVar3 + 0x10 + lVar17) + 0x70);
        }
        else {
          plVar12 = (long *)(lVar4 + 0x50);
        }
      }
      _Var5._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>.
      _M_head_impl = (this->field_generators_).field_generators_.
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)((lVar3 - *plVar12) + lVar17) >> 3) * 0x38e38e39]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                     ._M_t;
      (**(code **)(*(long *)_Var5._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                            ._M_head_impl + 0x30))
                (_Var5._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x48;
    } while (lVar18 < *(int *)(this->descriptor_ + 4));
  }
  io::Printer::Print<>
            (printer,
             "@java.lang.Override\npublic final Builder setUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.setUnknownFields(unknownFields);\n}\n\n@java.lang.Override\npublic final Builder mergeUnknownFields(\n    final com.google.protobuf.UnknownFieldSet unknownFields) {\n  return super.mergeUnknownFields(unknownFields);\n}\n\n"
            );
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x3fed9e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(this->descriptor_ + 8) + 0x20));
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.ExtendableBuilder<\n"
        "      $classname$, Builder> implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  } else {
    printer->Print(
        "public static final class Builder extends\n"
        "    com.google.protobuf.GeneratedMessage$ver$.Builder<Builder> "
        "implements\n"
        "    $extra_interfaces$\n"
        "    $classname$OrBuilder {\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "ver",
        GeneratedCodeVersionSuffix());
  }
  printer->Indent();

  GenerateDescriptorMethods(printer);
  GenerateCommonBuilderMethods(printer);

  if (context_->HasGeneratedMethods(descriptor_)) {
    GenerateIsInitialized(printer);
    GenerateBuilderParsingMethods(printer);
  }

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());
    // oneofCase_ and oneof_
    printer->Print(vars,
                   "private int $oneof_name$Case_ = 0;\n"
                   "private java.lang.Object $oneof_name$_;\n");
    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return $oneof_capitalized_name$Case.forNumber(\n"
                   "      $oneof_name$Case_);\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  $oneof_name$Case_ = 0;\n"
                   "  $oneof_name$_ = null;\n");
    printer->Print("  onChanged();\n");
    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }

  // Integers for bit fields.
  int totalBits = 0;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    totalBits +=
        field_generators_.get(descriptor_->field(i)).GetNumBitsForBuilder();
  }
  int totalInts = (totalBits + 31) / 32;
  for (int i = 0; i < totalInts; i++) {
    printer->Print("private int $bit_field_name$;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  // Override methods declared in GeneratedMessage to return the concrete
  // generated type so callsites won't depend on GeneratedMessage. This
  // is needed to keep binary compatibility when we change generated code
  // to subclass a different GeneratedMessage class (e.g., in v3.0.0 release
  // we changed all generated code to subclass GeneratedMessageV3).
  printer->Print(
      "@java.lang.Override\n"
      "public final Builder setUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.setUnknownFields(unknownFields);\n"
      "}\n"
      "\n"
      "@java.lang.Override\n"
      "public final Builder mergeUnknownFields(\n"
      "    final com.google.protobuf.UnknownFieldSet unknownFields) {\n"
      "  return super.mergeUnknownFields(unknownFields);\n"
      "}\n"
      "\n");

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}